

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void __thiscall
kratos::InlineGeneratorVisitor::RenameLinkedVar::visit(RenameLinkedVar *this,AssertBase *param_1)

{
  InternalException *this_00;
  string local_40;
  allocator<char> local_19;
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Assertion inline not implemented",&local_19);
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void visit(AssertBase*) override {
            throw InternalException("Assertion inline not implemented");
        }